

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::ArenaTest_RepeatedPtrFieldMoveCtorOnArena_Test::
~ArenaTest_RepeatedPtrFieldMoveCtorOnArena_Test
          (ArenaTest_RepeatedPtrFieldMoveCtorOnArena_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ArenaTest, RepeatedPtrFieldMoveCtorOnArena) {
  Arena arena;

  ASSERT_EQ(arena.SpaceUsed(), 0);

  auto* original = Arena::Create<RepeatedPtrField<TestAllTypes>>(&arena);
  auto* msg = original->Add();
  TestUtil::SetAllFields(msg);
  TestUtil::ExpectAllFieldsSet(*msg);

  auto usage_original = arena.SpaceUsed();
  auto* moved = Arena::Create<RepeatedPtrField<TestAllTypes>>(
      &arena, std::move(*original));
  auto usage_by_move = arena.SpaceUsed() - usage_original;

  EXPECT_EQ(moved->size(), 1);
  TestUtil::ExpectAllFieldsSet(moved->Get(0));

  // The only extra allocation with moves is sizeof(RepeatedPtrField).
  EXPECT_EQ(usage_by_move, sizeof(internal::RepeatedPtrFieldBase));
  EXPECT_LT(usage_by_move + sizeof(TestAllTypes), usage_original);

  // Status after move is unspecified and must not be assumed. It's merely
  // checking current implementation specifics for protobuf internal.
  EXPECT_EQ(original->size(), 0);
}